

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.cpp
# Opt level: O2

void __thiscall
chrono::ChTimestepperNewmark::ArchiveOUT(ChTimestepperNewmark *this,ChArchiveOut *archive)

{
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChTimestepperNewmark>(archive);
  ChTimestepper::ArchiveOUT((ChTimestepper *)this,archive);
  ChImplicitIterativeTimestepper::ArchiveOUT(&this->super_ChImplicitIterativeTimestepper,archive);
  local_30._value = &this->beta;
  local_30._name = "beta";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(archive,&local_30);
  local_48._value = &this->gamma;
  local_48._name = "gamma";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(archive,&local_48);
  return;
}

Assistant:

void ChTimestepperNewmark::ArchiveOUT(ChArchiveOut& archive) {
    // version number
    archive.VersionWrite<ChTimestepperNewmark>();
    // serialize parent class:
    ChTimestepperIIorder::ArchiveOUT(archive);
    ChImplicitIterativeTimestepper::ArchiveOUT(archive);
    // serialize all member data:
    archive << CHNVP(beta);
    archive << CHNVP(gamma);
}